

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O1

MainFunc __thiscall capnp::compiler::CompilerMain::getEvalMain(CompilerMain *this)

{
  StringPtr extendedDescription;
  StringPtr helpText;
  Iface *pIVar1;
  Iface *pIVar2;
  MainBuilder *pMVar3;
  Iface *extraout_RDX;
  CompilerMain *in_RSI;
  StringPtr version;
  MainFunc MVar4;
  StringPtr briefDescription;
  StringPtr argumentTitle;
  StringPtr helpText_00;
  StringPtr helpText_01;
  StringPtr helpText_02;
  StringPtr helpText_03;
  initializer_list<kj::MainBuilder::OptionName> names;
  initializer_list<kj::MainBuilder::OptionName> names_00;
  initializer_list<kj::MainBuilder::OptionName> names_01;
  initializer_list<kj::MainBuilder::OptionName> names_02;
  initializer_list<kj::MainBuilder::OptionName> names_03;
  StringPtr title;
  StringPtr title_00;
  MainBuilder builder;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_138;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_128;
  Function<kj::MainBuilder::Validity_()> local_118;
  Function<kj::MainBuilder::Validity_()> local_108;
  Function<kj::MainBuilder::Validity_()> local_f8;
  Function<kj::MainBuilder::Validity_()> local_e8;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_d8;
  MainBuilder local_c8;
  OptionName local_b8;
  OptionName local_a8;
  char *local_98;
  undefined8 uStack_90;
  char *local_88;
  undefined8 uStack_80;
  OptionName local_78;
  undefined1 local_68;
  char *local_60;
  OptionName local_58;
  undefined1 local_48;
  char *local_40;
  OptionName local_38;
  undefined1 local_28;
  char *local_20;
  
  in_RSI->annotationFlag = DROP_ANNOTATIONS;
  in_RSI->compileEagerness = 1;
  in_RSI->convertTo = TEXT;
  ModuleLoader::setFileIdsRequired(&in_RSI->loader,false);
  local_88 = 
  "By default the value is written in text format and can have any type.  The -b, -p, and --flat flags specify binary output, in which case the const must be of struct type."
  ;
  uStack_80 = 0xab;
  extendedDescription.content.size_ = 0xab;
  extendedDescription.content.ptr =
       "By default the value is written in text format and can have any type.  The -b, -p, and --flat flags specify binary output, in which case the const must be of struct type."
  ;
  version.content.size_ = 0x1c;
  version.content.ptr = "Cap\'n Proto version 2.0-dev";
  briefDescription.content.size_ = 0x2ee;
  briefDescription.content.ptr =
       "Prints (or encodes) the value of <name>, which must be defined in <schema-file>.  <name> must refer to a const declaration, a field of a struct type (prints the default value), or a field or list element nested within some other value.  Examples:\n    capnp eval myschema.capnp MyType.someField\n    capnp eval myschema.capnp someConstant\n    capnp eval myschema.capnp someConstant.someField\n    capnp eval myschema.capnp someConstant.someList[4]\n    capnp eval myschema.capnp someConstant.someList[4].anotherField[1][2][3]\nSince consts can have complex struct types, and since you can define a const using import and variable substitution, this can be a convenient way to write text-format config files which are compiled to binary before deployment."
  ;
  kj::MainBuilder::MainBuilder
            (&local_c8,in_RSI->context,version,briefDescription,extendedDescription);
  addGlobalOptions(in_RSI,&local_c8);
  local_38.isLong = false;
  local_38.field_1.shortName = 'o';
  local_28 = 1;
  local_20 = "output";
  local_d8.impl.ptr = (Iface *)operator_new(0x18);
  (local_d8.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0028a070;
  local_d8.impl.ptr[1]._vptr_Iface = (_func_int **)in_RSI;
  local_d8.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEvalMain()::{lambda(auto:1&,(auto:2&&)...)#1},capnp::compiler::CompilerMain::getEvalMain()::{lambda(auto:1&,(auto:2&&)...)#2}>>>
        ::instance;
  local_98 = 
  "Encode the output in the given format. See `capnp help convert` for a list of formats. Defaults to \"text\"."
  ;
  uStack_90 = 0x6b;
  helpText.content.size_ = 0x6b;
  helpText.content.ptr =
       "Encode the output in the given format. See `capnp help convert` for a list of formats. Defaults to \"text\"."
  ;
  argumentTitle.content.size_ = 9;
  argumentTitle.content.ptr = "<format>";
  names._M_len = 2;
  names._M_array = &local_38;
  pMVar3 = kj::MainBuilder::addOptionWithArg(&local_c8,names,&local_d8,argumentTitle,helpText);
  local_58.isLong = false;
  local_58.field_1.shortName = 'b';
  local_48 = 1;
  local_40 = "binary";
  local_e8.impl.ptr = (Iface *)operator_new(0x18);
  (local_e8.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0028a0d8;
  local_e8.impl.ptr[1]._vptr_Iface = (_func_int **)in_RSI;
  local_e8.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity()>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEvalMain()::{lambda(auto:1&,(auto:2&&)...)#3},capnp::compiler::CompilerMain::getEvalMain()::{lambda(auto:1&,(auto:2&&)...)#4}>>>
        ::instance;
  helpText_00.content.size_ = 0x11;
  helpText_00.content.ptr = "same as -obinary";
  names_00._M_len = 2;
  names_00._M_array = &local_58;
  pMVar3 = kj::MainBuilder::addOption(pMVar3,names_00,&local_e8,helpText_00);
  local_a8.isLong = true;
  local_a8.field_1.longName = "flat";
  local_f8.impl.ptr = (Iface *)operator_new(0x18);
  (local_f8.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0028a140;
  local_f8.impl.ptr[1]._vptr_Iface = (_func_int **)in_RSI;
  local_f8.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity()>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEvalMain()::{lambda(auto:1&,(auto:2&&)...)#5},capnp::compiler::CompilerMain::getEvalMain()::{lambda(auto:1&,(auto:2&&)...)#6}>>>
        ::instance;
  helpText_01.content.size_ = 0xf;
  helpText_01.content.ptr = "same as -oflat";
  names_01._M_len = 1;
  names_01._M_array = &local_a8;
  pMVar3 = kj::MainBuilder::addOption(pMVar3,names_01,&local_f8,helpText_01);
  local_78.isLong = false;
  local_78.field_1.shortName = 'p';
  local_68 = 1;
  local_60 = "packed";
  local_108.impl.ptr = (Iface *)operator_new(0x18);
  (local_108.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0028a1a8;
  local_108.impl.ptr[1]._vptr_Iface = (_func_int **)in_RSI;
  local_108.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity()>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEvalMain()::{lambda(auto:1&,(auto:2&&)...)#7},capnp::compiler::CompilerMain::getEvalMain()::{lambda(auto:1&,(auto:2&&)...)#8}>>>
        ::instance;
  helpText_02.content.size_ = 0x11;
  helpText_02.content.ptr = "same as -opacked";
  names_02._M_len = 2;
  names_02._M_array = &local_78;
  pMVar3 = kj::MainBuilder::addOption(pMVar3,names_02,&local_108,helpText_02);
  local_b8.isLong = true;
  local_b8.field_1.longName = "short";
  local_118.impl.ptr = (Iface *)operator_new(0x18);
  (local_118.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0028a210;
  local_118.impl.ptr[1]._vptr_Iface = (_func_int **)in_RSI;
  local_118.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity()>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEvalMain()::{lambda(auto:1&,(auto:2&&)...)#9},capnp::compiler::CompilerMain::getEvalMain()::{lambda(auto:1&,(auto:2&&)...)#10}>>>
        ::instance;
  helpText_03.content.size_ = 0xa0;
  helpText_03.content.ptr =
       "If output format is text or JSON, write in short (non-pretty) format. The message will be printed on one line, without using whitespace to improve readability."
  ;
  names_03._M_len = 1;
  names_03._M_array = &local_b8;
  pMVar3 = kj::MainBuilder::addOption(pMVar3,names_03,&local_118,helpText_03);
  local_128.impl.ptr = (Iface *)operator_new(0x18);
  (local_128.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0028a278;
  local_128.impl.ptr[1]._vptr_Iface = (_func_int **)in_RSI;
  local_128.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEvalMain()::{lambda(auto:1&,(auto:2&&)...)#11},capnp::compiler::CompilerMain::getEvalMain()::{lambda(auto:1&,(auto:2&&)...)#12}>>>
        ::instance;
  title.content.size_ = 0xe;
  title.content.ptr = "<schema-file>";
  pMVar3 = kj::MainBuilder::expectArg(pMVar3,title,&local_128);
  local_138.impl.ptr = (Iface *)operator_new(0x18);
  (local_138.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0028a2e0;
  local_138.impl.ptr[1]._vptr_Iface = (_func_int **)in_RSI;
  local_138.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEvalMain()::{lambda(auto:1&,(auto:2&&)...)#13},capnp::compiler::CompilerMain::getEvalMain()::{lambda(auto:1&,(auto:2&&)...)#14}>>>
        ::instance;
  title_00.content.size_ = 7;
  title_00.content.ptr = "<name>";
  kj::MainBuilder::expectArg(pMVar3,title_00,&local_138);
  pIVar1 = local_138.impl.ptr;
  if (local_138.impl.ptr != (Iface *)0x0) {
    local_138.impl.ptr = (Iface *)0x0;
    (**(local_138.impl.disposer)->_vptr_Disposer)
              (local_138.impl.disposer,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface);
  }
  pIVar1 = local_128.impl.ptr;
  if (local_128.impl.ptr != (Iface *)0x0) {
    local_128.impl.ptr = (Iface *)0x0;
    (**(local_128.impl.disposer)->_vptr_Disposer)
              (local_128.impl.disposer,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface);
  }
  pIVar2 = local_118.impl.ptr;
  if (local_118.impl.ptr != (Iface *)0x0) {
    local_118.impl.ptr = (Iface *)0x0;
    (**(local_118.impl.disposer)->_vptr_Disposer)
              (local_118.impl.disposer,pIVar2->_vptr_Iface[-2] + (long)&pIVar2->_vptr_Iface);
  }
  pIVar2 = local_108.impl.ptr;
  if (local_108.impl.ptr != (Iface *)0x0) {
    local_108.impl.ptr = (Iface *)0x0;
    (**(local_108.impl.disposer)->_vptr_Disposer)
              (local_108.impl.disposer,pIVar2->_vptr_Iface[-2] + (long)&pIVar2->_vptr_Iface);
  }
  pIVar2 = local_f8.impl.ptr;
  if (local_f8.impl.ptr != (Iface *)0x0) {
    local_f8.impl.ptr = (Iface *)0x0;
    (**(local_f8.impl.disposer)->_vptr_Disposer)
              (local_f8.impl.disposer,pIVar2->_vptr_Iface[-2] + (long)&pIVar2->_vptr_Iface);
  }
  pIVar2 = local_e8.impl.ptr;
  if (local_e8.impl.ptr != (Iface *)0x0) {
    local_e8.impl.ptr = (Iface *)0x0;
    (**(local_e8.impl.disposer)->_vptr_Disposer)
              (local_e8.impl.disposer,pIVar2->_vptr_Iface[-2] + (long)&pIVar2->_vptr_Iface);
  }
  pIVar1 = local_d8.impl.ptr;
  if (local_d8.impl.ptr != (Iface *)0x0) {
    local_d8.impl.ptr = (Iface *)0x0;
    (**(local_d8.impl.disposer)->_vptr_Disposer)
              (local_d8.impl.disposer,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface);
  }
  kj::MainBuilder::build((MainBuilder *)this);
  kj::MainBuilder::~MainBuilder(&local_c8);
  MVar4.impl.ptr = extraout_RDX;
  MVar4.impl.disposer = (Disposer *)this;
  return (MainFunc)MVar4.impl;
}

Assistant:

kj::MainFunc getEvalMain() {
    // Only parse the schemas we actually need for decoding.
    compileEagerness = Compiler::NODE;

    // Drop annotations since we don't need them.  This avoids importing files like c++.capnp.
    annotationFlag = Compiler::DROP_ANNOTATIONS;

    // Default convert to text unless -o is given.
    convertTo = Format::TEXT;

    // When using `capnp eval`, type IDs don't really matter, because `eval` won't actually use
    // them for anything. When using Cap'n Proto an a config format -- the common use case for
    // `capnp eval` -- the exercise of adding a file ID to every file is pointless busy work. So,
    // we don't require it.
    loader.setFileIdsRequired(false);

    kj::MainBuilder builder(context, VERSION_STRING,
          "Prints (or encodes) the value of <name>, which must be defined in <schema-file>.  "
          "<name> must refer to a const declaration, a field of a struct type (prints the default "
          "value), or a field or list element nested within some other value.  Examples:\n"
          "    capnp eval myschema.capnp MyType.someField\n"
          "    capnp eval myschema.capnp someConstant\n"
          "    capnp eval myschema.capnp someConstant.someField\n"
          "    capnp eval myschema.capnp someConstant.someList[4]\n"
          "    capnp eval myschema.capnp someConstant.someList[4].anotherField[1][2][3]\n"
          "Since consts can have complex struct types, and since you can define a const using "
          "import and variable substitution, this can be a convenient way to write text-format "
          "config files which are compiled to binary before deployment.",

          "By default the value is written in text format and can have any type.  The -b, -p, "
          "and --flat flags specify binary output, in which case the const must be of struct "
          "type.");
    addGlobalOptions(builder);
    builder.addOptionWithArg({'o', "output"}, KJ_BIND_METHOD(*this, setEvalOutputFormat),
                      "<format>", "Encode the output in the given format. See `capnp help convert` "
                      "for a list of formats. Defaults to \"text\".")
           .addOption({'b', "binary"}, KJ_BIND_METHOD(*this, codeBinary),
                      "same as -obinary")
           .addOption({"flat"}, KJ_BIND_METHOD(*this, codeFlat),
                      "same as -oflat")
           .addOption({'p', "packed"}, KJ_BIND_METHOD(*this, codePacked),
                      "same as -opacked")
           .addOption({"short"}, KJ_BIND_METHOD(*this, printShort),
                      "If output format is text or JSON, write in short (non-pretty) format. The "
                      "message will be printed on one line, without using whitespace to improve "
                      "readability.")
           .expectArg("<schema-file>", KJ_BIND_METHOD(*this, addSource))
           .expectArg("<name>", KJ_BIND_METHOD(*this, evalConst));
    return builder.build();
  }